

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t BrotliMaxDistanceSymbol(uint32_t ndirect,uint32_t npostfix)

{
  int iVar1;
  uint32_t postfix;
  uint32_t npostfix_local;
  uint32_t ndirect_local;
  
  iVar1 = 1 << ((byte)npostfix & 0x1f);
  if (ndirect < BrotliMaxDistanceSymbol::bound[npostfix]) {
    npostfix_local = ndirect + BrotliMaxDistanceSymbol::diff[npostfix] + iVar1;
  }
  else if (BrotliMaxDistanceSymbol::bound[npostfix] + iVar1 < ndirect) {
    npostfix_local = ndirect + BrotliMaxDistanceSymbol::diff[npostfix];
  }
  else {
    npostfix_local =
         BrotliMaxDistanceSymbol::bound[npostfix] + BrotliMaxDistanceSymbol::diff[npostfix] + iVar1;
  }
  return npostfix_local;
}

Assistant:

static uint32_t BrotliMaxDistanceSymbol(uint32_t ndirect, uint32_t npostfix) {
  static const uint32_t bound[BROTLI_MAX_NPOSTFIX + 1] = {0, 4, 12, 28};
  static const uint32_t diff[BROTLI_MAX_NPOSTFIX + 1] = {73, 126, 228, 424};
  uint32_t postfix = 1U << npostfix;
  if (ndirect < bound[npostfix]) {
    return ndirect + diff[npostfix] + postfix;
  } else if (ndirect > bound[npostfix] + postfix) {
    return ndirect + diff[npostfix];
  } else {
    return bound[npostfix] + diff[npostfix] + postfix;
  }
}